

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O3

int __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::HaveK
          (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *C,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k)

{
  uint uVar1;
  pointer pcVar2;
  pointer pbVar3;
  size_t __n;
  int iVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  
  uVar1 = this->N - 1;
  uVar7 = 0;
  if (this->N < 2) {
LAB_00134e2a:
    uVar5 = 0;
    if ((uint)uVar7 != uVar1) {
      uVar5 = (uint)((C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7 & 0xffffffff] != '0');
    }
  }
  else {
    pcVar2 = (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    lVar6 = 8;
    uVar7 = 0;
    do {
      if (pcVar2[uVar7] != '1') goto LAB_00134e2a;
      pbVar3 = (C->k).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __n = *(size_t *)((long)&(pbVar3->_M_dataplus)._M_p + lVar6);
      if ((__n == k->_M_string_length) &&
         ((__n == 0 ||
          (iVar4 = bcmp(*(void **)((long)pbVar3 + lVar6 + -8),(k->_M_dataplus)._M_p,__n), iVar4 == 0
          )))) goto LAB_00134e2a;
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x20;
    } while (uVar1 != uVar7);
    uVar5 = 0;
  }
  return uVar5;
}

Assistant:

int BpTree<K>::HaveK(IndexNode<K> C, K k) {
	int i;
	for (i = 0; i < N - 1 && C.v[i] == '1' && C.k[i] != k; i++);
	if (i == N - 1 || C.v[i] == '0')		return 0;
	else									return 1;
}